

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rapass_p.h
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseRAPass::assignRAInst
          (BaseRAPass *this,BaseNode *node,RABlock *block,RAInstBuilder *ib)

{
  byte bVar1;
  long lVar2;
  uint32_t uVar3;
  anon_union_4_2_a70401ef_for_RATiedReg_3 aVar4;
  RegMask RVar5;
  bool bVar6;
  RATiedFlags RVar7;
  RAInst *pRVar8;
  RATiedReg *pRVar9;
  RAWorkReg **ppRVar10;
  uint32_t *puVar11;
  byte *pbVar12;
  long in_RCX;
  long in_RDX;
  long in_RSI;
  RAInstBuilder *in_RDI;
  RATiedReg *dst;
  RegGroup group;
  RAWorkReg *workReg;
  RATiedReg *tiedReg;
  uint32_t i;
  RATiedFlags flagsFilter;
  RARegIndex index;
  RAInst *raInst;
  uint32_t tiedRegCount;
  RATiedReg *in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe94;
  RARegIndex *in_stack_fffffffffffffea0;
  RATiedReg *pRVar13;
  RARegMask *in_stack_fffffffffffffeb0;
  undefined8 in_stack_fffffffffffffeb8;
  RATiedFlags in_stack_fffffffffffffec0;
  InstRWFlags in_stack_fffffffffffffec4;
  uint uVar14;
  undefined4 in_stack_fffffffffffffec8;
  uint32_t in_stack_fffffffffffffecc;
  BaseRAPass *in_stack_fffffffffffffed0;
  Error local_100;
  
  lVar2 = *(long *)(in_RCX + 0x38);
  pRVar8 = newRAInst(in_stack_fffffffffffffed0,
                     (RABlock *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                     in_stack_fffffffffffffec4,in_stack_fffffffffffffec0,
                     (uint32_t)((ulong)in_stack_fffffffffffffeb8 >> 0x20),in_stack_fffffffffffffeb0)
  ;
  if (pRVar8 == (RAInst *)0x0) {
    local_100 = DebugUtils::errored(1);
  }
  else {
    RVar7 = *(RATiedFlags *)(in_RCX + 0xc) ^ ~kNone;
    RARegIndex::buildIndexes(in_stack_fffffffffffffea0,(RARegCount *)in_RDI);
    (pRVar8->_tiedIndex).super_RARegCount.field_0._packed = in_stack_fffffffffffffecc;
    (pRVar8->_tiedCount).field_0 = *(anon_union_4_2_ebeb14a8_for_RARegCount_0 *)(in_RCX + 0x10);
    for (uVar14 = 0; uVar14 < (uint)(lVar2 - (in_RCX + 0x40) >> 5); uVar14 = uVar14 + 1) {
      pRVar9 = RAInstBuilder::operator[]
                         (in_RDI,CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      ppRVar10 = ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[]
                           ((ZoneVector<asmjit::v1_14::RAWorkReg_*> *)in_RDI,
                            CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      *(undefined8 *)(*ppRVar10 + 0x10) = 0;
      if ((pRVar9->field_3).field_0._useId != 0xff) {
        *(uint *)(in_RDX + 0xc) = *(uint *)(in_RDX + 0xc) | 0x800;
        in_stack_fffffffffffffe94 = 1 << ((pRVar9->field_3).field_0._useId & 0x1f);
        puVar11 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                            ((RARegMask *)
                             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                             (RegGroup *)in_stack_fffffffffffffe88);
        *puVar11 = in_stack_fffffffffffffe94 | *puVar11;
      }
      if ((pRVar9->field_3).field_0._outId != 0xff) {
        *(uint *)(in_RDX + 0xc) = *(uint *)(in_RDX + 0xc) | 0x800;
      }
      in_stack_fffffffffffffe88 = pRVar8->_tiedRegs;
      pbVar12 = RARegCount::operator[]
                          ((RARegCount *)in_RDI,(RegGroup)(in_stack_fffffffffffffe94 >> 0x18));
      bVar1 = *pbVar12;
      *pbVar12 = bVar1 + 1;
      pRVar13 = in_stack_fffffffffffffe88 + bVar1;
      uVar3 = pRVar9->_consecutiveParent;
      pRVar13->_workId = pRVar9->_workId;
      pRVar13->_consecutiveParent = uVar3;
      aVar4 = pRVar9->field_3;
      pRVar13->_flags = pRVar9->_flags;
      pRVar13->field_3 = aVar4;
      RVar5 = pRVar9->_outRegMask;
      pRVar13->_useRegMask = pRVar9->_useRegMask;
      pRVar13->_outRegMask = RVar5;
      uVar3 = pRVar9->_outRewriteMask;
      pRVar13->_useRewriteMask = pRVar9->_useRewriteMask;
      pRVar13->_outRewriteMask = uVar3;
      pRVar13->_flags = pRVar13->_flags & RVar7;
      bVar6 = Support::test<asmjit::v1_14::RATiedFlags,asmjit::v1_14::RATiedFlags>
                        (pRVar9->_flags,kDuplicate);
      if (!bVar6) {
        puVar11 = RARegMask::operator[]<asmjit::v1_14::RegGroup>
                            ((RARegMask *)
                             CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                             (RegGroup *)in_stack_fffffffffffffe88);
        pRVar13->_useRegMask = (*puVar11 ^ 0xffffffff) & pRVar13->_useRegMask;
      }
    }
    *(RAInst **)(in_RSI + 0x20) = pRVar8;
    local_100 = 0;
  }
  return local_100;
}

Assistant:

ASMJIT_FORCE_INLINE Error assignRAInst(BaseNode* node, RABlock* block, RAInstBuilder& ib) noexcept {
    uint32_t tiedRegCount = ib.tiedRegCount();
    RAInst* raInst = newRAInst(block, ib.instRWFlags(), ib.aggregatedFlags(), tiedRegCount, ib._clobbered);

    if (ASMJIT_UNLIKELY(!raInst))
      return DebugUtils::errored(kErrorOutOfMemory);

    RARegIndex index;
    RATiedFlags flagsFilter = ~ib.forbiddenFlags();

    index.buildIndexes(ib._count);
    raInst->_tiedIndex = index;
    raInst->_tiedCount = ib._count;

    for (uint32_t i = 0; i < tiedRegCount; i++) {
      RATiedReg* tiedReg = ib[i];
      RAWorkReg* workReg = workRegById(tiedReg->workId());

      workReg->resetTiedReg();
      RegGroup group = workReg->group();

      if (tiedReg->hasUseId()) {
        block->addFlags(RABlockFlags::kHasFixedRegs);
        raInst->_usedRegs[group] |= Support::bitMask(tiedReg->useId());
      }

      if (tiedReg->hasOutId()) {
        block->addFlags(RABlockFlags::kHasFixedRegs);
      }

      RATiedReg& dst = raInst->_tiedRegs[index[group]++];
      dst = *tiedReg;
      dst._flags &= flagsFilter;

      if (!tiedReg->isDuplicate())
        dst._useRegMask &= ~ib._used[group];
    }

    node->setPassData<RAInst>(raInst);
    return kErrorOk;
  }